

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void sigint_handler(int signo)

{
  int in_EDI;
  
  printf("\x1b[0m");
  if (in_EDI == 2) {
    if ((is_interacting & 1U) != 0) {
      _exit(0x82);
    }
    is_interacting = true;
  }
  return;
}

Assistant:

void sigint_handler(int signo) {
    printf(ANSI_COLOR_RESET);
    if (signo == SIGINT) {
        if (!is_interacting) {
            is_interacting=true;
        } else {
            _exit(130);
        }
    }
}